

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHash.c
# Opt level: O0

deBool deTestHash_copyToArray
                 (deTestHash *hash,deTestInt16Array *keyArray,deTestIntArray *valueArray)

{
  int size;
  deBool dVar1;
  int local_44;
  deTestHashSlot *pdStack_40;
  int elemNdx;
  deTestHashSlot *slot;
  int local_30;
  int slotNdx;
  int arrayNdx;
  int numElements;
  deTestIntArray *valueArray_local;
  deTestInt16Array *keyArray_local;
  deTestHash *hash_local;
  
  size = hash->numElements;
  local_30 = 0;
  if (keyArray == (deTestInt16Array *)0x0) {
LAB_0036085d:
    if (valueArray != (deTestIntArray *)0x0) {
      dVar1 = deTestIntArray_setSize(valueArray,size);
      if (dVar1 == 0) goto LAB_00360875;
    }
    for (slot._4_4_ = 0; slot._4_4_ < hash->slotTableSize; slot._4_4_ = slot._4_4_ + 1) {
      for (pdStack_40 = hash->slotTable[slot._4_4_]; pdStack_40 != (deTestHashSlot *)0x0;
          pdStack_40 = pdStack_40->nextSlot) {
        for (local_44 = 0; local_44 < pdStack_40->numUsed; local_44 = local_44 + 1) {
          if (keyArray != (deTestInt16Array *)0x0) {
            deTestInt16Array_set(keyArray,local_30,pdStack_40->keys[local_44]);
          }
          if (valueArray != (deTestIntArray *)0x0) {
            deTestIntArray_set(valueArray,local_30,pdStack_40->values[local_44]);
          }
          local_30 = local_30 + 1;
        }
      }
    }
    hash_local._4_4_ = 1;
  }
  else {
    dVar1 = deTestInt16Array_setSize(keyArray,size);
    if (dVar1 != 0) goto LAB_0036085d;
LAB_00360875:
    hash_local._4_4_ = 0;
  }
  return hash_local._4_4_;
}

Assistant:

void dePoolHash_selfTest (void)
{
	deMemPool*	pool	= deMemPool_createRoot(DE_NULL, 0);
	deTestHash*	hash	= deTestHash_create(pool);
	int			iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Test find() on empty hash. */
		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 0);
		for (i = 0; i < 15000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			DE_TEST_ASSERT(!val);
		}

		/* Test insert(). */
		for (i = 0; i < 5000; i++)
		{
			deTestHash_insert(hash, (deInt16)i, -i);
		}

		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 5000);
		for (i = 0; i < 5000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			DE_TEST_ASSERT(val && (*val == -i));
		}

		/* Test delete(). */
		for (i = 0; i < 1000; i++)
			deTestHash_delete(hash, (deInt16)i);

		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 4000);
		for (i = 0; i < 25000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			if (deInBounds32(i, 1000, 5000))
				DE_TEST_ASSERT(val && (*val == -i));
			else
				DE_TEST_ASSERT(!val);
		}

		/* Test insert() after delete(). */
		for (i = 10000; i < 12000; i++)
			deTestHash_insert(hash, (deInt16)i, -i);

		for (i = 0; i < 25000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			if (deInBounds32(i, 1000, 5000) || deInBounds32(i, 10000, 12000))
				DE_TEST_ASSERT(val && (*val == -i));
			else
				DE_TEST_ASSERT(!val);
		}

		/* Test iterator. */
		{
			deTestHashIter	testIter;
			int				numFound = 0;

			for (deTestHashIter_init(hash, &testIter); deTestHashIter_hasItem(&testIter); deTestHashIter_next(&testIter))
			{
				deInt16	key	= deTestHashIter_getKey(&testIter);
				int		val	= deTestHashIter_getValue(&testIter);
				DE_TEST_ASSERT(deInBounds32(key, 1000, 5000) || deInBounds32(key, 10000, 12000));
				DE_TEST_ASSERT(*deTestHash_find(hash, key) == -key);
				DE_TEST_ASSERT(val == -key);
				numFound++;
			}

			DE_TEST_ASSERT(numFound == deTestHash_getNumElements(hash));
		}

		/* Test copy-to-array. */
		{
			deTestInt16Array*	keyArray	= deTestInt16Array_create(pool);
			deTestIntArray*		valueArray	= deTestIntArray_create(pool);
			int					numElements	= deTestHash_getNumElements(hash);
			int					ndx;

			deTestHash_copyToArray(hash, keyArray, DE_NULL);
			DE_TEST_ASSERT(deTestInt16Array_getNumElements(keyArray) == numElements);

			deTestHash_copyToArray(hash, DE_NULL, valueArray);
			DE_TEST_ASSERT(deTestIntArray_getNumElements(valueArray) == numElements);

			deTestInt16Array_setSize(keyArray, 0);
			deTestIntArray_setSize(valueArray, 0);
			deTestHash_copyToArray(hash, keyArray, valueArray);
			DE_TEST_ASSERT(deTestInt16Array_getNumElements(keyArray) == numElements);
			DE_TEST_ASSERT(deTestIntArray_getNumElements(valueArray) == numElements);

			for (ndx = 0; ndx < numElements; ndx++)
			{
				deInt16 key = deTestInt16Array_get(keyArray, ndx);
				int		val = deTestIntArray_get(valueArray, ndx);

				DE_TEST_ASSERT(val == -key);
				DE_TEST_ASSERT(*deTestHash_find(hash, key) == val);
			}
		}

		/* Test reset(). */
		deTestHash_reset(hash);
		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 0);
	}

	deMemPool_destroy(pool);
}